

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O2

int Kit_SopBestLiteral(Kit_Sop_t *cSop,int nLits,uint uMask)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = 0;
  if (nLits < 1) {
    nLits = 0;
  }
  uVar3 = 0xffffffff;
  uVar2 = 0xffffffff;
  for (; uVar1 != nLits; uVar1 = uVar1 + 1) {
    if ((uMask >> (uVar1 & 0x1f) & 1) != 0) {
      uVar6 = 0;
      uVar5 = (ulong)(uint)cSop->nCubes;
      if (cSop->nCubes < 1) {
        uVar5 = uVar6;
      }
      uVar4 = 0;
      for (; (uVar5 != uVar6 && (cSop->pCubes[uVar6] != 0)); uVar6 = uVar6 + 1) {
        uVar4 = uVar4 + ((cSop->pCubes[uVar6] >> (uVar1 & 0x1f) & 1) != 0);
      }
      if (1 < uVar4 && (int)uVar2 < (int)uVar4) {
        uVar2 = uVar4;
        uVar3 = uVar1;
      }
    }
  }
  uVar1 = 0xffffffff;
  if (-1 < (int)uVar2) {
    uVar1 = uVar3;
  }
  return uVar1;
}

Assistant:

int Kit_SopBestLiteral( Kit_Sop_t * cSop, int nLits, unsigned uMask )
{
    unsigned uCube;
    int i, k, iMax, nLitsMax, nLitsCur;
    int fUseFirst = 1;

    // go through each literal
    iMax = -1;
    nLitsMax = -1;
    for ( i = 0; i < nLits; i++ )
    {
        if ( !Kit_CubeHasLit(uMask, i) )
            continue;
        // go through all the cubes
        nLitsCur = 0;
        Kit_SopForEachCube( cSop, uCube, k )
            if ( Kit_CubeHasLit(uCube, i) )
                nLitsCur++;
        // skip the literal that does not occur or occurs once
        if ( nLitsCur < 2 )
            continue;
        // check if this is the best literal
        if ( fUseFirst )
        {
            if ( nLitsMax < nLitsCur )
            {
                nLitsMax = nLitsCur;
                iMax = i;
            }
        }
        else
        {
            if ( nLitsMax <= nLitsCur )
            {
                nLitsMax = nLitsCur;
                iMax = i;
            }
        }
    }
    if ( nLitsMax >= 0 )
        return iMax;
    return -1;
}